

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t match_path_inclusion(archive_match *a,match *m,wchar_t mbs,void *pn)

{
  int iVar1;
  wchar_t wVar2;
  int *piVar3;
  undefined4 in_register_00000014;
  char *p;
  
  iVar1 = a->recursive_include;
  wVar2 = archive_mstring_get_mbs(&a->archive,&m->pattern,&p);
  if (wVar2 == L'\0') {
    wVar2 = __archive_pathmatch(p,(char *)CONCAT44(in_register_00000014,mbs),(uint)(iVar1 != 0) * 2)
    ;
  }
  else {
    piVar3 = __errno_location();
    wVar2 = L'\0';
    if (*piVar3 == 0xc) {
      error_nomem(a);
      wVar2 = L'\xffffffe2';
    }
  }
  return wVar2;
}

Assistant:

static int
match_path_inclusion(struct archive_match *a, struct match *m,
    int mbs, const void *pn)
{
	/* Recursive operation requires only a prefix match. */
	int flag = a->recursive_include ?
		PATHMATCH_NO_ANCHOR_END :
		0;
	int r;

	if (mbs) {
		const char *p;
		r = archive_mstring_get_mbs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch(p, (const char *)pn, flag));
	} else {
		const wchar_t *p;
		r = archive_mstring_get_wcs(&(a->archive), &(m->pattern), &p);
		if (r == 0)
			return (archive_pathmatch_w(p, (const wchar_t *)pn,
				flag));
	}
	if (errno == ENOMEM)
		return (error_nomem(a));
	return (0);
}